

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdPrint_rec(FILE *pFile,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  uint uVar3;
  int iVar4;
  Kit_DsdObj_t *pKVar5;
  int iVar6;
  ulong uVar7;
  
  pKVar5 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar5 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x147,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    iVar6 = Id + 0x61;
  }
  else {
    KVar2 = *pKVar5;
    uVar3 = (uint)KVar2 >> 6 & 7;
    if (uVar3 == 2) {
      if (((uint)KVar2 & 0xfc000000) != 0x4000000) {
        __assert_fail("pObj->nFans == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x154,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
      }
    }
    else if (uVar3 == 1) {
      if ((uint)KVar2 < 0x4000000) {
        fwrite("Const1",6,1,(FILE *)pFile);
        return;
      }
      __assert_fail("pObj->nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x14e,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    iVar6 = 0x2a;
    if (uVar3 != 3) {
      iVar6 = (uVar3 != 4) + 0x2b;
    }
    if (((uint)KVar2 & 0x1c0) == 0x140) {
      Kit_DsdPrintHex(pFile,(uint *)(&pKVar5[1].field_0x0 + ((uint)KVar2 >> 8 & 0x3fc)),
                      (uint)KVar2 >> 0x1a);
    }
    fputc(0x28,(FILE *)pFile);
    for (uVar7 = 0; uVar7 < (uint)*pKVar5 >> 0x1a; uVar7 = uVar7 + 1) {
      uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + uVar7 * 2);
      iVar4 = Abc_LitIsCompl((uint)uVar1);
      if (iVar4 != 0) {
        fputc(0x21,(FILE *)pFile);
      }
      iVar4 = Abc_Lit2Var((uint)uVar1);
      Kit_DsdPrint_rec(pFile,pNtk,iVar4);
      if (uVar7 < ((uint)*pKVar5 >> 0x1a) - 1) {
        fputc(iVar6,(FILE *)pFile);
      }
    }
    iVar6 = 0x29;
  }
  fputc(iVar6,(FILE *)pFile);
  return;
}

Assistant:

void Kit_DsdPrint_rec( FILE * pFile, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i;
    char Symbol;

    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        fprintf( pFile, "%c", 'a' + Id );
        return;
    }

    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        fprintf( pFile, "Const1" );
        return;
    }

    if ( pObj->Type == KIT_DSD_VAR )
        assert( pObj->nFans == 1 );

    if ( pObj->Type == KIT_DSD_AND )
        Symbol = '*';
    else if ( pObj->Type == KIT_DSD_XOR )
        Symbol = '+';
    else 
        Symbol = ',';

    if ( pObj->Type == KIT_DSD_PRIME )
        Kit_DsdPrintHex( pFile, Kit_DsdObjTruth(pObj), pObj->nFans );

    fprintf( pFile, "(" );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        if ( Abc_LitIsCompl(iLit) ) 
            fprintf( pFile, "!" );
        Kit_DsdPrint_rec( pFile, pNtk, Abc_Lit2Var(iLit) );
        if ( i < pObj->nFans - 1 )
            fprintf( pFile, "%c", Symbol );
    }
    fprintf( pFile, ")" );
}